

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O2

int record_pool_block(amqp_pool_blocklist_t *x,void *block)

{
  size_t __size;
  void **ppvVar1;
  int iVar2;
  
  iVar2 = x->num_blocks;
  __size = (long)iVar2 * 8 + 8;
  if (x->blocklist == (void **)0x0) {
    ppvVar1 = (void **)malloc(__size);
    x->blocklist = ppvVar1;
    if (ppvVar1 == (void **)0x0) {
      return 0;
    }
  }
  else {
    ppvVar1 = (void **)realloc(x->blocklist,__size);
    if (ppvVar1 == (void **)0x0) {
      return 0;
    }
    x->blocklist = ppvVar1;
    iVar2 = x->num_blocks;
  }
  ppvVar1[iVar2] = block;
  x->num_blocks = iVar2 + 1;
  return 1;
}

Assistant:

static int record_pool_block(amqp_pool_blocklist_t *x, void *block)
{
  size_t blocklistlength = sizeof(void *) * (x->num_blocks + 1);

  if (x->blocklist == NULL) {
    x->blocklist = malloc(blocklistlength);
    if (x->blocklist == NULL) {
      return 0;
    }
  } else {
    void *newbl = realloc(x->blocklist, blocklistlength);
    if (newbl == NULL) {
      return 0;
    }
    x->blocklist = newbl;
  }

  x->blocklist[x->num_blocks] = block;
  x->num_blocks++;
  return 1;
}